

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffcpsr(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,char *row_status,
          int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  FITSfile *pFVar3;
  int iVar4;
  void *pvVar5;
  void *extraout_RAX;
  long lVar6;
  size_t __size;
  int *piVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  int nInVarCols;
  LONGLONG innaxis1;
  int nOutVarCols;
  LONGLONG hrepeat;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  void *local_d0;
  int local_c4;
  uchar *local_c0;
  int *local_b8;
  long local_b0;
  size_t local_a8;
  int local_9c;
  long local_98;
  long *local_90;
  int *local_88;
  long local_80;
  size_t local_78;
  size_t local_70;
  long local_68;
  LONGLONG local_60;
  long local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_c4 = 0;
  local_9c = 0;
  local_78 = 0;
  local_60 = 0;
  iVar4 = *status;
  if (iVar4 < 1) {
    if (infptr->HDUposition == infptr->Fptr->curhdu) {
      if (infptr->Fptr->datastart == -1) {
        ffrdef(infptr,status);
      }
    }
    else {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
      if (outfptr->Fptr->datastart == -1) {
        ffrdef(outfptr,status);
      }
    }
    else {
      ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar4 = *status;
    if (iVar4 < 1) {
      iVar4 = infptr->Fptr->hdutype;
      if ((iVar4 == 0) || (iVar2 = outfptr->Fptr->hdutype, iVar2 == 0)) {
        ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
        *status = 0xeb;
        iVar4 = 0xeb;
      }
      else if ((iVar2 == 1 && iVar4 == 2) || (iVar2 == 2 && iVar4 == 1)) {
        ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
        *status = 0xe3;
        iVar4 = 0xe3;
      }
      else {
        ffgkyjj(infptr,"NAXIS1",(LONGLONG *)&local_a8,(char *)0x0,status);
        ffgkyjj(infptr,"NAXIS2",&local_38,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS1",(LONGLONG *)&local_40,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS2",&local_58,(char *)0x0,status);
        iVar4 = *status;
        if (iVar4 < 1) {
          if (local_40 == local_a8) {
            if (local_38 < nrows + firstrow + -1) {
              ffpmsg("Not enough rows in input table to copy (ffcprw)");
              *status = 0x133;
              iVar4 = 0x133;
            }
            else {
              iVar4 = infptr->Fptr->tfield;
              local_90 = (long *)(long)iVar4;
              iVar2 = outfptr->Fptr->tfield;
              if (iVar4 == iVar2) {
                local_c0 = (uchar *)malloc(local_a8);
                if (local_c0 == (uchar *)0x0) {
                  ffpmsg("Unable to allocate memory (ffcprw)");
                  *status = 0x71;
                  iVar4 = 0x71;
                }
                else {
                  local_b8 = (int *)malloc((long)local_90 << 2);
                  local_88 = (int *)malloc((long)iVar2 << 2);
                  fffvcl(infptr,&local_c4,local_b8,status);
                  fffvcl(outfptr,&local_9c,local_88,status);
                  if (local_c4 == local_9c) {
                    if (0 < local_c4) {
                      lVar6 = 0;
                      do {
                        if (local_b8[lVar6] != local_88[lVar6]) goto LAB_0011e4c2;
                        lVar6 = lVar6 + 1;
                      } while (local_c4 != lVar6);
                    }
                    local_b0 = local_58 + 1;
                    if (local_c4 == 0) {
                      if (nrows < 1) {
                        local_d0 = (void *)0x0;
                        lVar6 = 0;
                      }
                      else {
                        local_d0 = (void *)0x0;
                        lVar6 = 0;
                        lVar9 = 0;
                        do {
                          if ((row_status == (char *)0x0) || (row_status[lVar9] != '\0')) {
                            local_98 = lVar6;
                            ffgtbb(infptr,lVar9 + firstrow,1,local_a8,local_c0,status);
                            ffptbb(outfptr,local_b0,1,local_a8,local_c0,status);
                            lVar6 = local_98 + 1;
                            local_b0 = local_b0 + 1;
                          }
                          lVar9 = lVar9 + 1;
                        } while (nrows != lVar9);
                      }
                    }
                    else {
                      local_98 = nrows;
                      if ((row_status != (char *)0x0) && (local_98 = 0, 0 < nrows)) {
                        lVar6 = 0;
                        do {
                          local_98 = (local_98 + 1) - (ulong)(row_status[lVar6] == '\0');
                          lVar6 = lVar6 + 1;
                        } while (nrows != lVar6);
                      }
                      ffirow(outfptr,local_58,local_98,status);
                      if (nrows < 1) {
                        local_d0 = (void *)0x0;
                        lVar6 = local_98;
                      }
                      else {
                        local_d0 = (void *)0x0;
                        local_70 = 0;
                        lVar9 = 0;
                        do {
                          if ((row_status == (char *)0x0) || (row_status[lVar9] != '\0')) {
                            local_50 = lVar9;
                            ffgtbb(infptr,firstrow,1,local_a8,local_c0,status);
                            ffptbb(outfptr,local_b0,1,local_a8,local_c0,status);
                            if (0 < infptr->Fptr->tfield) {
                              plVar10 = &infptr->Fptr->tableptr->twidth;
                              lVar6 = 1;
                              lVar9 = 0;
                              piVar7 = local_b8;
                              do {
                                lVar8 = lVar6;
                                if ((lVar9 < local_c4) && (lVar6 == piVar7[lVar9])) {
                                  local_90 = plVar10;
                                  local_80 = lVar6;
                                  local_48 = lVar9;
                                  ffgdesll(infptr,(int)lVar6,firstrow,(LONGLONG *)&local_78,
                                           &local_60,status);
                                  __size = local_78;
                                  if (*(int *)(local_90 + -9) != -0x10) {
                                    if (*(int *)(local_90 + -9) == -1) {
                                      lVar6 = local_78 + 0xe;
                                      if (-1 < (long)(local_78 + 7)) {
                                        lVar6 = local_78 + 7;
                                      }
                                      __size = lVar6 >> 3;
                                    }
                                    else {
                                      __size = local_78 * *local_90;
                                    }
                                  }
                                  pFVar3 = outfptr->Fptr;
                                  local_68 = pFVar3->heapstart + pFVar3->datastart +
                                             pFVar3->heapsize;
                                  ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart +
                                                local_60,0,status);
                                  pFVar3 = outfptr->Fptr;
                                  if (pFVar3->lasthdu == 0) {
                                    if ((pFVar3->headstart[(long)pFVar3->curhdu + 1] <
                                         (long)(local_68 + __size)) &&
                                       (iVar4 = ffiblk(outfptr,(long)(local_68 + __size +
                                                                     ~pFVar3->headstart
                                                                      [(long)pFVar3->curhdu + 1]) /
                                                               0xb40 + 1,1,status), 0 < iVar4)) {
                                      ffpmsg(
                                            "Failed to extend the size of the variable length heap (ffcprw)"
                                            );
                                      goto LAB_0011e5ca;
                                    }
                                  }
                                  if (__size != 0) {
                                    if ((long)local_70 < (long)__size) {
                                      pvVar5 = realloc(local_d0,__size);
                                      if (pvVar5 == (void *)0x0) {
                                        *status = 0x71;
                                        ffpmsg(
                                              "failed to allocate memory for variable column copy (ffcprw)"
                                              );
                                        iVar4 = 5;
                                        pvVar5 = extraout_RAX;
                                      }
                                      else {
                                        iVar4 = 0;
                                        local_d0 = pvVar5;
                                        local_70 = __size;
                                      }
                                      if (iVar4 != 0) {
                                        if (iVar4 != 5) {
                                          return (int)pvVar5;
                                        }
                                        goto LAB_0011e5ca;
                                      }
                                    }
                                    ffgbyt(infptr,__size,local_d0,status);
                                    ffmbyt(outfptr,local_68,1,status);
                                    ffpbyt(outfptr,__size,local_d0,status);
                                  }
                                  ffpdes(outfptr,(int)local_80,local_b0,local_78,
                                         outfptr->Fptr->heapsize,status);
                                  pLVar1 = &outfptr->Fptr->heapsize;
                                  *pLVar1 = *pLVar1 + __size;
                                  lVar9 = local_48 + 1;
                                  piVar7 = local_b8;
                                  lVar8 = local_80;
                                  plVar10 = local_90;
                                }
                                plVar10 = plVar10 + 0x14;
                                lVar6 = lVar8 + 1;
                              } while (lVar8 < infptr->Fptr->tfield);
                            }
                            local_b0 = local_b0 + 1;
                            lVar9 = local_50;
                          }
                          lVar9 = lVar9 + 1;
                          firstrow = firstrow + 1;
                          lVar6 = local_98;
                        } while (lVar9 != nrows);
                      }
                    }
                    local_58 = local_58 + lVar6;
                    ffuky(outfptr,0x51,"NAXIS2",&local_58,(char *)0x0,status);
                  }
                  else {
LAB_0011e4c2:
                    ffpmsg("Input and output tables have different variable columns (ffcprw)");
                    *status = 0x12e;
                    local_d0 = (void *)0x0;
                  }
LAB_0011e5ca:
                  free(local_c0);
                  free(local_b8);
                  free(local_88);
                  if (local_d0 != (void *)0x0) {
                    free(local_d0);
                  }
                  iVar4 = *status;
                }
              }
              else {
                ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
                *status = 0x12e;
                iVar4 = 0x12e;
              }
            }
          }
          else {
            ffpmsg("Input and output tables do not have same width (ffcprw)");
            *status = 0xf1;
            iVar4 = 0xf1;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ffcpsr(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
	   char *row_status,    /* I - quality list of rows to keep (1) or not keep (0) */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, i0, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    LONGLONG n_good_rows = nrows;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
      if (row_status) {
	for (n_good_rows = 0, ii = 0; ii < nrows; ii++) {
	  if (row_status[ii]) n_good_rows++; 
	}
      }

       ffirow(outfptr, outnaxis2, n_good_rows, status);
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       n_good_rows = 0;
       for (ii = firstrow, i0 = 0; i0 < nrows; i0++, ii++)
       {
	  /* Ignore rows with row_status[] == 0 */
	  if (row_status && !row_status[i0]) continue;

           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
	   n_good_rows ++;
           jj++;
       }
    }
    outnaxis2 += n_good_rows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}